

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

String * Json::(anonymous_namespace)::valueToString_abi_cxx11_
                   (double value,bool useSpecialFloats,uint precision,PrecisionType precisionType)

{
  char *pcVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  reference __s;
  size_t __maxlen;
  ulong uVar5;
  ulong uVar6;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  begin;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  end;
  long lVar7;
  int in_ECX;
  uint in_EDX;
  byte in_SIL;
  String *in_RDI;
  double in_XMM0_Qa;
  size_t wouldPrint;
  int len;
  String *buffer;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffec8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffed0;
  char *local_108;
  int local_d4;
  undefined8 local_a8;
  undefined8 local_88;
  undefined8 local_70;
  undefined8 local_50;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  int local_34;
  allocator local_2e;
  undefined1 local_2d;
  allocator local_1d;
  int local_1c;
  uint local_18;
  byte local_11;
  double local_10;
  
  local_11 = in_SIL & 1;
  local_1c = in_ECX;
  local_18 = in_EDX;
  local_10 = in_XMM0_Qa;
  bVar3 = std::isfinite(in_XMM0_Qa);
  if (bVar3) {
    local_2d = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,0x24,'\0',&local_2e);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e);
    while( true ) {
      local_40._M_current = (char *)std::__cxx11::string::begin();
      __s = __gnu_cxx::
            __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator*(&local_40);
      __maxlen = std::__cxx11::string::size();
      if (local_1c == 0) {
        local_108 = "%.*g";
      }
      else {
        local_108 = "%.*f";
      }
      local_34 = snprintf(__s,__maxlen,local_108,local_10,(ulong)local_18);
      if (local_34 < 0) {
        __assert_fail("len >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbrunie[P]PyFloT/external-deps/jsoncpp/src/lib_json/json_writer.cpp"
                      ,0x91,
                      "String Json::(anonymous namespace)::valueToString(double, bool, unsigned int, PrecisionType)"
                     );
      }
      uVar5 = (ulong)local_34;
      uVar6 = std::__cxx11::string::size();
      if (uVar5 < uVar6) break;
      std::__cxx11::string::resize((ulong)in_RDI);
    }
    std::__cxx11::string::resize((ulong)in_RDI);
    std::__cxx11::string::begin();
    std::__cxx11::string::end();
    begin = fixNumericLocale<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                      (in_stack_fffffffffffffec8,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )0x2085bb);
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              (in_stack_fffffffffffffed0,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffffec8._M_current);
    std::__cxx11::string::end();
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              (in_stack_fffffffffffffed0,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffffec8._M_current);
    end._M_current = (char *)std::__cxx11::string::erase(in_RDI,local_50,local_70);
    if (local_1c == 1) {
      std::__cxx11::string::begin();
      std::__cxx11::string::end();
      fixZerosInTheEnd<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(begin,end);
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                (in_stack_fffffffffffffed0,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffec8._M_current);
      std::__cxx11::string::end();
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                (in_stack_fffffffffffffed0,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffec8._M_current);
      std::__cxx11::string::erase(in_RDI,local_88,local_a8);
    }
    lVar7 = std::__cxx11::string::find((char)in_RDI,0x2e);
    if ((lVar7 == -1) && (lVar7 = std::__cxx11::string::find((char)in_RDI,0x65), lVar7 == -1)) {
      std::__cxx11::string::operator+=((string *)in_RDI,".0");
    }
  }
  else {
    bVar2 = local_11 & 1;
    uVar4 = std::isnan(local_10);
    if ((uVar4 & 1) == 0) {
      local_d4 = 2;
      if (local_10 < 0.0) {
        local_d4 = 1;
      }
    }
    else {
      local_d4 = 0;
    }
    pcVar1 = anon_unknown_0::valueToString::reps[(int)(uint)(bVar2 == 0)][local_d4];
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,pcVar1,&local_1d);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d);
  }
  return in_RDI;
}

Assistant:

String valueToString(double value,
                     bool useSpecialFloats,
                     unsigned int precision,
                     PrecisionType precisionType) {
  // Print into the buffer. We need not request the alternative representation
  // that always has a decimal point because JSON doesn't distinguish the
  // concepts of reals and integers.
  if (!isfinite(value)) {
    static const char* const reps[2][3] = {{"NaN", "-Infinity", "Infinity"},
                                           {"null", "-1e+9999", "1e+9999"}};
    return reps[useSpecialFloats ? 0 : 1]
               [isnan(value) ? 0 : (value < 0) ? 1 : 2];
  }

  String buffer(size_t(36), '\0');
  while (true) {
    int len = jsoncpp_snprintf(
        &*buffer.begin(), buffer.size(),
        (precisionType == PrecisionType::significantDigits) ? "%.*g" : "%.*f",
        precision, value);
    assert(len >= 0);
    auto wouldPrint = static_cast<size_t>(len);
    if (wouldPrint >= buffer.size()) {
      buffer.resize(wouldPrint + 1);
      continue;
    }
    buffer.resize(wouldPrint);
    break;
  }

  buffer.erase(fixNumericLocale(buffer.begin(), buffer.end()), buffer.end());

  // strip the zero padding from the right
  if (precisionType == PrecisionType::decimalPlaces) {
    buffer.erase(fixZerosInTheEnd(buffer.begin(), buffer.end()), buffer.end());
  }

  // try to ensure we preserve the fact that this was given to us as a double on
  // input
  if (buffer.find('.') == buffer.npos && buffer.find('e') == buffer.npos) {
    buffer += ".0";
  }
  return buffer;
}